

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_table.c
# Opt level: O3

void hash_table_display(hash_table_t *h,int32 showdisplay)

{
  char *__format;
  hash_entry_s *phVar1;
  long lVar2;
  uint uVar3;
  hash_entry_s *phVar4;
  hash_entry_t *phVar5;
  
  puts("Hash with chaining representation of the hash table");
  if (h->size < 1) {
    uVar3 = 0;
  }
  else {
    __format = "%p";
    if (showdisplay != 0) {
      __format = "%s";
    }
    lVar2 = 0;
    uVar3 = 0;
    do {
      if (h->table[lVar2].key != (char *)0x0) {
        phVar5 = h->table + lVar2;
        printf("|key:");
        printf(__format,phVar5->key);
        printf("|len:%zd|val=%ld|->",phVar5->len,phVar5->val);
        if (phVar5->next == (hash_entry_s *)0x0) {
          puts("NULL");
          phVar4 = phVar5->next;
          uVar3 = uVar3 + 1;
          if (phVar4 == (hash_entry_s *)0x0) goto LAB_001095b9;
        }
        else {
          uVar3 = uVar3 + 1;
          phVar4 = phVar5->next;
        }
        do {
          printf("|key:");
          if (showdisplay != 0) {
            printf("%s",phVar4->key);
          }
          printf("|len:%zd|val=%ld|->",phVar4->len,phVar4->val);
          phVar1 = phVar4->next;
          if (phVar1 == (hash_entry_s *)0x0) {
            puts("NULL");
            phVar1 = phVar4->next;
          }
          uVar3 = uVar3 + 1;
          phVar4 = phVar1;
        } while (phVar1 != (hash_entry_s *)0x0);
      }
LAB_001095b9:
      lVar2 = lVar2 + 1;
    } while (lVar2 < h->size);
  }
  printf("The total number of keys =%d\n",(ulong)uVar3);
  return;
}

Assistant:

void
hash_table_display(hash_table_t * h, int32 showdisplay)
{
    hash_entry_t *e;
    int i, j;
    j = 0;

    printf("Hash with chaining representation of the hash table\n");

    for (i = 0; i < h->size; i++) {
        e = &(h->table[i]);
        if (e->key != NULL) {
            printf("|key:");
            if (showdisplay)
                printf("%s", e->key);
            else
                printf("%p", e->key);

            printf("|len:%zd|val=%ld|->", e->len, (long)e->val);
            if (e->next == NULL) {
                printf("NULL\n");
            }
            j++;

            for (e = e->next; e; e = e->next) {
                printf("|key:");
                if (showdisplay)
                    printf("%s", e->key);

                printf("|len:%zd|val=%ld|->", e->len, (long)e->val);
                if (e->next == NULL) {
                    printf("NULL\n");
                }
                j++;
            }
        }
    }

    printf("The total number of keys =%d\n", j);
}